

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::SetPlotQuery(ImPlotLimits *query,ImPlotYAxis y_axis)

{
  bool bVar1;
  ImPlotYAxis local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  ImPlotPoint local_58;
  ImVec2 local_48;
  ImVec2 p2;
  ImVec2 local_30;
  ImVec2 p1;
  ImPlotPlot *plot;
  ImPlotContext *gp;
  ImPlotYAxis y_axis_local;
  ImPlotLimits *query_local;
  
  bVar1 = false;
  if ((-2 < y_axis) && (bVar1 = false, y_axis < 3)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xad4,"void ImPlot::SetPlotQuery(const ImPlotLimits &, ImPlotYAxis)");
  }
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    p1 = (ImVec2)GImPlot->CurrentPlot;
    local_90 = y_axis;
    if (y_axis < 0) {
      local_90 = GImPlot->CurrentPlot->CurrentYAxis;
    }
    UpdateTransformCache();
    _p2 = ImPlotLimits::Min(query);
    local_30 = PlotToPixels((ImPlotPoint *)&p2,local_90);
    local_58 = ImPlotLimits::Max(query);
    local_48 = PlotToPixels(&local_58,local_90);
    *(undefined1 *)((long)p1 + 0x28d) = 1;
    *(undefined1 *)((long)p1 + 0x28c) = 0;
    local_78 = ImMin(&local_30,&local_48);
    local_70 = operator-(&local_78,(ImVec2 *)((long)p1 + 0x2c8));
    local_88 = ImMax(&local_30,&local_48);
    local_80 = operator-(&local_88,(ImVec2 *)((long)p1 + 0x2c8));
    ImRect::ImRect(&local_68,&local_70,&local_80);
    *(ImVec2 *)((long)p1 + 0x278) = local_68.Min;
    *(ImVec2 *)((long)p1 + 0x280) = local_68.Max;
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xad5,"void ImPlot::SetPlotQuery(const ImPlotLimits &, ImPlotYAxis)");
}

Assistant:

void SetPlotQuery(const ImPlotLimits& query, ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    UpdateTransformCache();
    ImVec2 p1 = PlotToPixels(query.Min(),y_axis);
    ImVec2 p2 = PlotToPixels(query.Max(),y_axis);
    plot.Queried = true;
    plot.Querying = false;
    plot.QueryRect = ImRect(ImMin(p1,p2)-plot.PlotRect.Min, ImMax(p1,p2)-plot.PlotRect.Min);
}